

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O1

void __thiscall
chrono::ChLoad<chrono::ChLoaderGravity>::LoadIntLoadResidual_Mv
          (ChLoad<chrono::ChLoaderGravity> *this,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  undefined1 auVar1 [16];
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ChLoadJacobians *pCVar4;
  double *pdVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long *plVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ChVectorDynamic<> grouped_w;
  ChVectorDynamic<> grouped_cMv;
  assign_op<double,_double> local_a9;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_98;
  double local_80;
  ulong local_78;
  ChVectorDynamic<> *local_70;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_68;
  
  if ((this->super_ChLoadBase).jacobians != (ChLoadJacobians *)0x0) {
    local_80 = c;
    iVar7 = (*(this->super_ChLoadBase).super_ChObj._vptr_ChObj[7])();
    local_a8.m_storage.m_data = (double *)0x0;
    local_a8.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_a8,(long)iVar7);
    iVar7 = (*(this->super_ChLoadBase).super_ChObj._vptr_ChObj[7])(this);
    local_98.m_storage.m_data = (double *)0x0;
    local_98.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,(long)iVar7);
    uVar11 = 0;
    iVar7 = 0;
    local_70 = R;
    while( true ) {
      peVar2 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
               super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        plVar13 = (long *)0x0;
      }
      else {
        plVar13 = (long *)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78));
      }
      p_Var3 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
               super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      iVar8 = (**(code **)(*plVar13 + 0x40))();
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (iVar8 <= iVar7) break;
      peVar2 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
               super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        plVar13 = (long *)0x0;
      }
      else {
        plVar13 = (long *)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78));
      }
      p_Var3 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
               super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      cVar6 = (**(code **)(*plVar13 + 0x58))(plVar13,iVar7);
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (cVar6 != '\0') {
        peVar2 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
                 super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 == (element_type *)0x0) {
          plVar13 = (long *)0x0;
        }
        else {
          plVar13 = (long *)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78));
        }
        p_Var3 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
                 super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        iVar8 = (**(code **)(*plVar13 + 0x48))(plVar13,iVar7);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        uVar14 = 0;
        local_78 = uVar11;
        while( true ) {
          peVar2 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
                   super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar2 == (element_type *)0x0) {
            plVar13 = (long *)0x0;
          }
          else {
            plVar13 = (long *)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78));
          }
          p_Var3 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
                   super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          uVar9 = (**(code **)(*plVar13 + 0x50))(plVar13,iVar7);
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          if (uVar9 <= uVar14) break;
          uVar10 = (ulong)(uint)(iVar8 + (int)uVar14);
          if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              <= (long)uVar10) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                         );
          }
          uVar12 = uVar11 + uVar14 & 0xffffffff;
          if (local_a8.m_storage.m_rows <= (long)uVar12) {
LAB_006ac52b:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          local_a8.m_storage.m_data[uVar12] =
               (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar10];
          uVar14 = uVar14 + 1;
        }
        uVar11 = (ulong)(uint)((int)local_78 + (int)uVar14);
      }
      iVar7 = iVar7 + 1;
    }
    pCVar4 = (this->super_ChLoadBase).jacobians;
    local_68.m_lhs.m_lhs.m_rows.m_value =
         (pCVar4->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows;
    local_68.m_lhs.m_lhs.m_cols.m_value =
         (pCVar4->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_cols;
    if ((local_68.m_lhs.m_lhs.m_cols.m_value | local_68.m_lhs.m_lhs.m_rows.m_value) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    local_68.m_lhs.m_rhs = &pCVar4->M;
    local_68.m_lhs.m_lhs.m_functor.m_other = local_80;
    local_68.m_rhs = (RhsNested)&local_a8;
    if (local_68.m_lhs.m_lhs.m_cols.m_value != local_a8.m_storage.m_rows) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                    "Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                   );
    }
    uVar11 = 0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_98,&local_68,&local_a9,(type)0x0);
    iVar7 = 0;
    while( true ) {
      peVar2 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
               super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        plVar13 = (long *)0x0;
      }
      else {
        plVar13 = (long *)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78));
      }
      p_Var3 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
               super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      iVar8 = (**(code **)(*plVar13 + 0x40))();
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (iVar8 <= iVar7) break;
      peVar2 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
               super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        plVar13 = (long *)0x0;
      }
      else {
        plVar13 = (long *)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78));
      }
      p_Var3 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
               super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      cVar6 = (**(code **)(*plVar13 + 0x58))(plVar13,iVar7);
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (cVar6 != '\0') {
        peVar2 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
                 super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2 == (element_type *)0x0) {
          plVar13 = (long *)0x0;
        }
        else {
          plVar13 = (long *)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78));
        }
        p_Var3 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
                 super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        iVar8 = (**(code **)(*plVar13 + 0x48))(plVar13,iVar7);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        uVar14 = 0;
        while( true ) {
          peVar2 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
                   super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar2 == (element_type *)0x0) {
            plVar13 = (long *)0x0;
          }
          else {
            plVar13 = (long *)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78));
          }
          p_Var3 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
                   super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          uVar9 = (**(code **)(*plVar13 + 0x50))(plVar13,iVar7);
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          if (uVar9 <= uVar14) break;
          uVar10 = uVar11 + uVar14 & 0xffffffff;
          if ((local_98.m_storage.m_rows <= (long)uVar10) ||
             (uVar12 = (ulong)(uint)(iVar8 + (int)uVar14),
             (local_70->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows <= (long)uVar12)) goto LAB_006ac52b;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = local_98.m_storage.m_data[uVar10];
          pdVar5 = (local_70->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = local_80;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pdVar5[uVar12];
          auVar1 = vfmadd213sd_fma(auVar15,auVar16,auVar1);
          pdVar5[uVar12] = auVar1._0_8_;
          uVar14 = uVar14 + 1;
        }
        uVar11 = (ulong)(uint)((int)uVar11 + (int)uVar14);
      }
      iVar7 = iVar7 + 1;
    }
    if (local_98.m_storage.m_data != (double *)0x0) {
      free((void *)local_98.m_storage.m_data[-1]);
    }
    if (local_a8.m_storage.m_data != (double *)0x0) {
      free((void *)local_a8.m_storage.m_data[-1]);
    }
  }
  return;
}

Assistant:

inline void ChLoad<Tloader>::LoadIntLoadResidual_Mv(ChVectorDynamic<>& R, const ChVectorDynamic<>& w, double c) {
    if (!this->jacobians)
        return;
    // fetch w as a contiguous vector
    ChVectorDynamic<> grouped_w(this->LoadGet_ndof_w());
    ChVectorDynamic<> grouped_cMv(this->LoadGet_ndof_w());
    unsigned int rowQ = 0;
    for (int i = 0; i < this->loader.GetLoadable()->GetSubBlocks(); ++i) {
        if (this->loader.GetLoadable()->IsSubBlockActive(i)) {
            unsigned int moffset = this->loader.GetLoadable()->GetSubBlockOffset(i);
            for (unsigned int row = 0; row < this->loader.GetLoadable()->GetSubBlockSize(i); ++row) {
                grouped_w(rowQ) = w(row + moffset);
                ++rowQ;
            }
        }
    }
    // do computation R=c*M*v
    grouped_cMv = c * this->jacobians->M * grouped_w;
    rowQ = 0;
    for (int i = 0; i < this->loader.GetLoadable()->GetSubBlocks(); ++i) {
        if (this->loader.GetLoadable()->IsSubBlockActive(i)) {
            unsigned int moffset = this->loader.GetLoadable()->GetSubBlockOffset(i);
            for (unsigned int row = 0; row < this->loader.GetLoadable()->GetSubBlockSize(i); ++row) {
                R(row + moffset) += grouped_cMv(rowQ) * c;
                ++rowQ;
            }
        }
    }
}